

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O1

void __thiscall geometrycentral::surface::SurfaceMesh::compressHalfedges(SurfaceMesh *this)

{
  pointer pcVar1;
  pointer puVar2;
  size_t *x;
  pointer puVar3;
  vector<char,_std::allocator<char>_> *permNewToOld;
  _List_node_base *p_Var4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newIndMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> oldIndMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newIndEdgeMap;
  size_t iEdge;
  vector<char,_std::allocator<char>_> local_98;
  vector<char,_std::allocator<char>_> local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  void *local_48;
  iterator iStack_40;
  unsigned_long *local_38;
  ulong local_30;
  
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start;
  permNewToOld = &local_98;
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38 = (unsigned_long *)0x0;
  local_48 = (void *)0x0;
  iStack_40._M_current = (unsigned_long *)0x0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_60,this->nHalfedgesFillCount,&INVALID_IND,(allocator_type *)&local_98);
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  if (this->nHalfedgesFillCount != 0) {
    do {
      permNewToOld = (vector<char,_std::allocator<char>_> *)
                     (this->heNextArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if ((&(((vector<unsigned_long,_std::allocator<unsigned_long>_> *)permNewToOld)->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start)
          [(long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start] != (pointer)0xffffffffffffffff) {
        permNewToOld = (vector<char,_std::allocator<char>_> *)
                       ((long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3);
        local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start
        [(long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start] = (unsigned_long)permNewToOld;
        if (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_78,
                     (iterator)
                     local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,(unsigned_long *)&local_98);
        }
        else {
          *(pointer *)
           local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_finish = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
          local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)((long)local_78.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_finish + 8);
        }
        if ((this->useImplicitTwinFlag == true) &&
           (((ulong)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start & 1) == 0)) {
          local_30 = (ulong)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start >> 1;
          if (iStack_40._M_current == local_38) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_48,iStack_40,
                       &local_30);
          }
          else {
            *iStack_40._M_current = local_30;
            iStack_40._M_current = iStack_40._M_current + 1;
          }
        }
      }
      local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start + 1);
    } while (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start < (pointer)this->nHalfedgesFillCount);
  }
  applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,
             (geometrycentral *)&this->heNextArr,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)permNewToOld);
  (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  puVar3 = (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._0_16_ =
       ZEXT816(0) << 0x20;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
  }
  if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,
             (geometrycentral *)&this->heVertexArr,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)permNewToOld);
  (this->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  puVar3 = (this->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  (this->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._0_16_ =
       ZEXT816(0) << 0x20;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
  }
  if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,
             (geometrycentral *)&this->heFaceArr,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)permNewToOld);
  (this->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  puVar3 = (this->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  (this->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._0_16_ =
       ZEXT816(0) << 0x20;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
  }
  if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (this->useImplicitTwinFlag == false) {
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,
               (geometrycentral *)&this->heSiblingArr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)permNewToOld);
    (this->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    puVar3 = (this->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    (this->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._0_16_
         = ZEXT816(0) << 0x20;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
    }
    if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,
               (geometrycentral *)&this->heEdgeArr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)permNewToOld);
    (this->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    puVar3 = (this->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    (this->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._0_16_
         = ZEXT816(0) << 0x20;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
    }
    if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    applyPermutation<char,std::allocator<char>,std::allocator<unsigned_long>>
              (&local_98,(geometrycentral *)&this->heOrientArr,&local_78,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)permNewToOld);
    (this->heOrientArr).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    pcVar1 = (this->heOrientArr).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->heOrientArr).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start;
    (this->heOrientArr).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._0_16_
         = ZEXT816(0) << 0x20;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pcVar1 != (pointer)0x0) {
      operator_delete(pcVar1);
    }
    if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,
               (geometrycentral *)&this->heVertInNextArr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)permNewToOld);
    (this->heVertInNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    puVar3 = (this->heVertInNextArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->heVertInNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    (this->heVertInNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._0_16_
         = ZEXT816(0) << 0x20;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
    }
    if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,
               (geometrycentral *)&this->heVertInPrevArr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)permNewToOld);
    (this->heVertInPrevArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    puVar3 = (this->heVertInPrevArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->heVertInPrevArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    (this->heVertInPrevArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._0_16_
         = ZEXT816(0) << 0x20;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
    }
    if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,
               (geometrycentral *)&this->heVertOutNextArr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)permNewToOld);
    (this->heVertOutNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    puVar3 = (this->heVertOutNextArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->heVertOutNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    (this->heVertOutNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._0_16_
         = ZEXT816(0) << 0x20;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
    }
    if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,
               (geometrycentral *)&this->heVertOutPrevArr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)permNewToOld);
    (this->heVertOutPrevArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    puVar3 = (this->heVertOutPrevArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->heVertOutPrevArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    (this->heVertOutPrevArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._0_16_
         = ZEXT816(0) << 0x20;
    local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3);
    }
    if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  puVar2 = (this->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->vHalfedgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
    if (*puVar3 != 0xffffffffffffffff) {
      *puVar3 = local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[*puVar3];
    }
  }
  puVar2 = (this->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->fHalfedgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
    if (*puVar3 != 0xffffffffffffffff) {
      *puVar3 = local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[*puVar3];
    }
  }
  puVar2 = (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
    if (*puVar3 != 0xffffffffffffffff) {
      *puVar3 = local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[*puVar3];
    }
  }
  if (this->useImplicitTwinFlag == false) {
    puVar2 = (this->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (puVar3 = (this->eHalfedgeArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
      if (*puVar3 != 0xffffffffffffffff) {
        *puVar3 = local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[*puVar3];
      }
    }
    puVar2 = (this->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (puVar3 = (this->heSiblingArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
      if (*puVar3 != 0xffffffffffffffff) {
        *puVar3 = local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[*puVar3];
      }
    }
    puVar2 = (this->heVertInNextArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar3 = (this->heVertInNextArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
      if (*puVar3 != 0xffffffffffffffff) {
        *puVar3 = local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[*puVar3];
      }
    }
    puVar2 = (this->heVertInPrevArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar3 = (this->heVertInPrevArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
      if (*puVar3 != 0xffffffffffffffff) {
        *puVar3 = local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[*puVar3];
      }
    }
    puVar2 = (this->vHeInStartArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar3 = (this->vHeInStartArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
      if (*puVar3 != 0xffffffffffffffff) {
        *puVar3 = local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[*puVar3];
      }
    }
    puVar2 = (this->heVertOutNextArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar3 = (this->heVertOutNextArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
      if (*puVar3 != 0xffffffffffffffff) {
        *puVar3 = local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[*puVar3];
      }
    }
    puVar2 = (this->heVertOutPrevArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar3 = (this->heVertOutPrevArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
      if (*puVar3 != 0xffffffffffffffff) {
        *puVar3 = local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[*puVar3];
      }
    }
    puVar2 = (this->vHeOutStartArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar3 = (this->vHeOutStartArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
      if (*puVar3 != 0xffffffffffffffff) {
        *puVar3 = local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[*puVar3];
      }
    }
  }
  this->nHalfedgesFillCount = this->nHalfedgesCount;
  this->nHalfedgesCapacityCount = this->nHalfedgesCount;
  p_Var4 = (_List_node_base *)&this->halfedgePermuteCallbackList;
  while( true ) {
    p_Var4 = (((_List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
                *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)&this->halfedgePermuteCallbackList) {
      if (this->useImplicitTwinFlag != false) {
        this->nEdgesFillCount = this->nEdgesCount;
        this->nEdgesCapacityCount = this->nEdgesCount;
        p_Var4 = (_List_node_base *)&this->edgePermuteCallbackList;
        while (p_Var4 = (((_List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
                           *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var4 != (_List_node_base *)&this->edgePermuteCallbackList) {
          if (p_Var4[2]._M_next == (_List_node_base *)0x0) {
            ::std::__throw_bad_function_call();
          }
          (*(code *)p_Var4[2]._M_prev)(p_Var4 + 1,&local_48);
        }
      }
      if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_48 != (void *)0x0) {
        operator_delete(local_48);
      }
      if (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return;
    }
    if (p_Var4[2]._M_next == (_List_node_base *)0x0) break;
    (*(code *)p_Var4[2]._M_prev)(p_Var4 + 1,&local_78);
  }
  ::std::__throw_bad_function_call();
}

Assistant:

void SurfaceMesh::compressHalfedges() {

  // Build the compressing shift
  std::vector<size_t> newIndMap;                                   // maps new ind -> old ind
  std::vector<size_t> newIndEdgeMap;                               // maps edge new ind -> old ind
  std::vector<size_t> oldIndMap(nHalfedgesFillCount, INVALID_IND); // maps old ind -> new ind
  for (size_t i = 0; i < nHalfedgesFillCount; i++) {
    if (!halfedgeIsDead(i)) {
      oldIndMap[i] = newIndMap.size();
      newIndMap.push_back(i);

      if (usesImplicitTwin() && i % 2 == 0) {
        size_t iEdge = i / 2;
        newIndEdgeMap.push_back(iEdge);
      }
    }
  }

  // Permute & resize all per-halfedge arrays
  heNextArr = applyPermutation(heNextArr, newIndMap);
  heVertexArr = applyPermutation(heVertexArr, newIndMap);
  heFaceArr = applyPermutation(heFaceArr, newIndMap);
  if (!usesImplicitTwin()) {
    heSiblingArr = applyPermutation(heSiblingArr, newIndMap);
    heEdgeArr = applyPermutation(heEdgeArr, newIndMap);
    heOrientArr = applyPermutation(heOrientArr, newIndMap);
    heVertInNextArr = applyPermutation(heVertInNextArr, newIndMap);
    heVertInPrevArr = applyPermutation(heVertInPrevArr, newIndMap);
    heVertOutNextArr = applyPermutation(heVertOutNextArr, newIndMap);
    heVertOutPrevArr = applyPermutation(heVertOutPrevArr, newIndMap);
  }


  // Update indices in all halfedge-valued arrays
  updateValues(vHalfedgeArr, oldIndMap);
  updateValues(fHalfedgeArr, oldIndMap);
  updateValues(heNextArr, oldIndMap);
  if (!usesImplicitTwin()) {
    updateValues(eHalfedgeArr, oldIndMap);
    updateValues(heSiblingArr, oldIndMap);
    updateValues(heVertInNextArr, oldIndMap);
    updateValues(heVertInPrevArr, oldIndMap);
    updateValues(vHeInStartArr, oldIndMap);
    updateValues(heVertOutNextArr, oldIndMap);
    updateValues(heVertOutPrevArr, oldIndMap);
    updateValues(vHeOutStartArr, oldIndMap);
  }

  // Update counts
  nHalfedgesFillCount = nHalfedgesCount;
  nHalfedgesCapacityCount = nHalfedgesCount;

  // Invoke callbacks
  for (auto& f : halfedgePermuteCallbackList) {
    f(newIndMap);
  }

  // In the implicit-twin case, we also need to update edge data here, because they are always in-sync with halfedges
  if (usesImplicitTwin()) {
    nEdgesFillCount = nEdgesCount;
    nEdgesCapacityCount = nEdgesCount;
    // Invoke callbacks
    for (auto& f : edgePermuteCallbackList) {
      f(newIndEdgeMap);
    }
  }
}